

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_QStringView_&,_QStringView_&>,_const_QStringView_&>,_char16_t>,_const_QStringView_&>,_QStringView_&>,_const_QStringView_&>
          *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char16_t *pcVar7;
  QStringView *pQVar8;
  qsizetype n;
  char16_t *__dest;
  
  lVar1 = ((this->a).a.a.a.a.a)->m_size;
  lVar2 = ((this->a).a.a.a.a.b)->m_size;
  lVar3 = ((this->a).a.a.a.b)->m_size;
  lVar4 = ((this->a).a.b)->m_size;
  lVar5 = ((this->a).b)->m_size;
  lVar6 = this->b->m_size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar6 + lVar1 + lVar2 + lVar3 + lVar4 + lVar5 + 1,
                   Uninitialized);
  pcVar7 = (__return_storage_ptr__->d).ptr;
  pQVar8 = (this->a).a.a.a.a.a;
  lVar1 = pQVar8->m_size;
  if (lVar1 != 0) {
    memcpy(pcVar7,pQVar8->m_data,lVar1 * 2);
  }
  pcVar7 = pcVar7 + lVar1;
  pQVar8 = (this->a).a.a.a.a.b;
  lVar1 = pQVar8->m_size;
  if (lVar1 != 0) {
    memcpy(pcVar7,pQVar8->m_data,lVar1 * 2);
  }
  pcVar7 = pcVar7 + lVar1;
  pQVar8 = (this->a).a.a.a.b;
  lVar1 = pQVar8->m_size;
  if (lVar1 != 0) {
    memcpy(pcVar7,pQVar8->m_data,lVar1 * 2);
  }
  pcVar7 = pcVar7 + lVar1;
  __dest = pcVar7 + 1;
  *pcVar7 = (this->a).a.a.b;
  pQVar8 = (this->a).a.b;
  lVar1 = pQVar8->m_size;
  if (lVar1 != 0) {
    memcpy(__dest,pQVar8->m_data,lVar1 * 2);
  }
  pQVar8 = (this->a).b;
  lVar2 = pQVar8->m_size;
  if (lVar2 != 0) {
    memcpy(__dest + lVar1,pQVar8->m_data,lVar2 * 2);
  }
  lVar3 = this->b->m_size;
  if (lVar3 != 0) {
    memcpy(__dest + lVar1 + lVar2,this->b->m_data,lVar3 * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }